

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O0

ParsedSection __thiscall
QDateTimeParser::findTimeZone
          (QDateTimeParser *this,QStringView str,QDateTime *when,int maxVal,int minVal,int mode)

{
  bool bVar1;
  QDateTimeParser *in_RDX;
  undefined8 in_RSI;
  QStringView *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  ParsedSection PVar2;
  QLatin1StringView s;
  int in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  QStringView in_stack_00000020;
  ParsedSection section;
  QStringView *in_stack_ffffffffffffff28;
  QStringView *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  byte in_stack_ffffffffffffff4e;
  undefined1 uVar3;
  QChar c;
  QChar local_82;
  undefined8 local_80;
  QDateTimeParser *local_78;
  undefined1 local_70 [20];
  int local_4c;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  State in_stack_ffffffffffffffc0;
  int iStack_38;
  undefined8 local_34;
  QChar local_2a;
  undefined8 local_28;
  QDateTimeParser *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  c.ucs = (char16_t)in_stack_ffffffffffffff4e;
  local_28 = in_RSI;
  local_20 = in_RDX;
  if (in_stack_00000008 == 1) {
    QChar::QChar<char16_t,_true>(&local_2a,L'Z');
    uVar3 = (undefined1)c.ucs;
    bVar1 = ::operator==(in_stack_ffffffffffffff30,(QChar *)in_stack_ffffffffffffff28);
    c.ucs = CONCAT11(bVar1,uVar3);
  }
  if ((char)((ushort)c.ucs >> 8) == '\0') {
    local_4c = -0x55555556;
    iStack_38 = -0x55555556;
    local_34 = &DAT_aaaaaaaaaaaaaaaa;
    ParsedSection::ParsedSection((ParsedSection *)&stack0xffffffffffffffc4,Invalid,0,0,0);
    if (in_stack_00000008 != 4) {
      PVar2 = findUtcOffset(local_20,in_stack_00000020,(int)((ulong)local_28 >> 0x20));
      local_4c = PVar2.value;
      in_stack_ffffffffffffffb8 = PVar2.used;
      in_stack_ffffffffffffffbc = PVar2.zeroes;
      in_stack_ffffffffffffffc0 = PVar2.state;
      local_34 = PVar2._8_8_;
      iStack_38 = in_stack_ffffffffffffffb8;
    }
    if (((in_stack_00000008 != 2) && (in_stack_00000008 != 3)) && (iStack_38 < 1)) {
      local_80 = local_28;
      local_78 = local_20;
      local_70._0_16_ =
           (undefined1  [16])
           findTimeZoneName((QDateTimeParser *)CONCAT44(local_4c,in_stack_ffffffffffffffc0),
                            (QStringView)in_stack_00000010,
                            (QDateTime *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      local_4c = local_70._0_4_;
      iStack_38 = local_70._4_4_;
      local_34 = (undefined1 *)local_70._8_8_;
    }
    if ((local_34._4_4_ == Acceptable) && ((local_4c < in_R9D || (in_R8D < local_4c)))) {
      local_34 = (undefined1 *)CONCAT44(1,(int)local_34);
    }
    if (iStack_38 < 1) {
      if (in_stack_00000008 == 1) {
        s = Qt::Literals::StringLiterals::operator____L1
                      (in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30);
        bVar1 = QStringView::startsWith(in_stack_ffffffffffffff28,s,CaseInsensitive);
        if (bVar1) {
          ParsedSection::ParsedSection((ParsedSection *)local_18,Acceptable,0,3,0);
          goto LAB_0076e002;
        }
        QChar::QChar<char16_t,_true>(&local_82,L'Z');
        bVar1 = QStringView::startsWith(in_RDI,c);
        if (bVar1) {
          ParsedSection::ParsedSection((ParsedSection *)local_18,Acceptable,0,1,0);
          goto LAB_0076e002;
        }
      }
      ParsedSection::ParsedSection((ParsedSection *)local_18,Invalid,0,0,0);
    }
    else {
      local_18._4_4_ = iStack_38;
      local_18._0_4_ = local_4c;
      local_18._8_8_ = local_34;
    }
  }
  else {
    ParsedSection::ParsedSection((ParsedSection *)local_18,Acceptable,0,1,0);
  }
LAB_0076e002:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  PVar2.zeroes = local_18._8_4_;
  PVar2.state = local_18._12_4_;
  PVar2.value = local_18._0_4_;
  PVar2.used = local_18._4_4_;
  return PVar2;
}

Assistant:

QDateTimeParser::ParsedSection
QDateTimeParser::findTimeZone(QStringView str, const QDateTime &when,
                              int maxVal, int minVal, int mode) const
{
    Q_ASSERT(mode > 0 && mode <= 4);
    // Short-cut Zulu suffix when it's all there is (rather than a prefix match):
    if (mode == 1 && str == u'Z')
        return ParsedSection(Acceptable, 0, 1);

    ParsedSection section;
    if (mode != 4)
        section = findUtcOffset(str, mode);
    if (mode != 2 && mode != 3 && section.used <= 0)  // if nothing used, try time zone parsing
        section = findTimeZoneName(str, when);
    // It can be a well formed time zone specifier, but with value out of range
    if (section.state == Acceptable && (section.value < minVal || section.value > maxVal))
        section.state = Intermediate;
    if (section.used > 0)
        return section;

    if (mode == 1) {
        // Check if string is UTC or alias to UTC, after all other options
        if (str.startsWith("UTC"_L1))
            return ParsedSection(Acceptable, 0, 3);
        if (str.startsWith(u'Z'))
            return ParsedSection(Acceptable, 0, 1);
    }

    return ParsedSection();
}